

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.h
# Opt level: O1

void __thiscall configFileReader::configFileReader(configFileReader *this,string *configFile)

{
  pointer *ppcVar1;
  iterator __position;
  undefined8 in_RAX;
  vector<char,_std::allocator<char>_> *pvVar2;
  undefined8 uStack_38;
  
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  this->index = 0;
  this->readFromString = false;
  uStack_38 = in_RAX;
  pvVar2 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->septarators = pvVar2;
  this->isOpen = false;
  (this->commentToken)._M_dataplus._M_p = (pointer)&(this->commentToken).field_2;
  (this->commentToken)._M_string_length = 0;
  (this->commentToken).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_replace
            ((ulong)&this->text,0,(char *)(this->text)._M_string_length,0x10d641);
  pvVar2 = this->septarators;
  uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
  __position._M_current =
       (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (pvVar2,__position,(char *)((long)&uStack_38 + 7));
  }
  else {
    *__position._M_current = '\"';
    ppcVar1 = &(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

configFileReader(string configFile) {
        fileName = configFile;
        text = "";
        septarators->push_back('"');
    }